

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiSettingsHandler * ImGui::FindSettingsHandler(char *type_name)

{
  uint uVar1;
  ImGuiSettingsHandler *pIVar2;
  ImGuiContext *pIVar3;
  long lVar4;
  ImU32 IVar5;
  ulong uVar6;
  long lVar7;
  
  pIVar3 = GImGui;
  IVar5 = ImHashStr(type_name,0,0);
  uVar1 = (pIVar3->SettingsHandlers).Size;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = 0;
  }
  lVar4 = -0x48;
  do {
    lVar7 = lVar4;
    if (uVar6 * 0x48 - (lVar7 + 0x48) == 0) {
      return (ImGuiSettingsHandler *)0x0;
    }
    pIVar2 = (pIVar3->SettingsHandlers).Data;
    lVar4 = lVar7 + 0x48;
  } while (*(ImU32 *)((long)&pIVar2[1].TypeHash + lVar7) != IVar5);
  return (ImGuiSettingsHandler *)((long)&pIVar2[1].TypeName + lVar7);
}

Assistant:

ImGuiSettingsHandler* ImGui::FindSettingsHandler(const char* type_name)
{
    ImGuiContext& g = *GImGui;
    const ImGuiID type_hash = ImHashStr(type_name);
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
        if (g.SettingsHandlers[handler_n].TypeHash == type_hash)
            return &g.SettingsHandlers[handler_n];
    return NULL;
}